

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall
DLevelScript::DLevelScript
          (DLevelScript *this,AActor *who,line_t_conflict *where,int num,ScriptPtr *code,
          FBehavior *module,int *args,int argcount,int flags)

{
  TArray<int,_int> *this_00;
  int *piVar1;
  int iVar2;
  int key;
  DACSThinker *pDVar3;
  Node *pNVar4;
  uint uVar5;
  long lVar6;
  FString local_50;
  int local_44;
  line_t_conflict *local_40;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_38;
  
  local_38.p = who;
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f12c0;
  this_00 = &this->Localvars;
  (this->Localvars).Array = (int *)0x0;
  (this->Localvars).Most = 0;
  (this->Localvars).Count = 0;
  this->activeBehavior = module;
  pDVar3 = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
  if (pDVar3 == (DACSThinker *)0x0) {
    pDVar3 = (DACSThinker *)DObject::operator_new(0x60);
    DACSThinker::DACSThinker(pDVar3);
  }
  this->script = num;
  if ((ushort)code->ArgCount <= code->VarCount) {
    TArray<int,_int>::Resize(this_00,(uint)code->VarCount);
    lVar6 = 0;
    local_44 = num;
    local_40 = where;
    memset(this_00->Array,0,(ulong)code->VarCount << 2);
    key = local_44;
    uVar5 = (uint)code->ArgCount;
    if (argcount < (int)(uint)code->ArgCount) {
      uVar5 = argcount;
    }
    piVar1 = this_00->Array;
    for (; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
      piVar1[lVar6] = args[lVar6];
    }
    this->pc = (int *)(module->Data + code->Address);
    lVar6 = ((long)code - (long)module->Scripts) / 0x38;
    iVar2 = -1;
    if (lVar6 < module->NumScripts) {
      iVar2 = (int)lVar6;
    }
    this->InModuleScriptNumber = iVar2;
    (this->activator).field_0 = local_38;
    this->activationline = local_40;
    this->backSide = (bool)((byte)flags & 1);
    this->activefont = SmallFont;
    this->hudwidth = 0;
    this->hudheight = 0;
    this->ClipRectLeft = 0;
    this->ClipRectTop = 0;
    this->ClipRectTop = 0;
    this->ClipRectWidth = 0;
    this->ClipRectHeight = 0;
    this->WrapWidth = 0;
    this->HandleAspect = true;
    this->state = SCRIPT_Running;
    if ((flags & 2U) == 0) {
      pDVar3 = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
      pNVar4 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::GetNode
                         (&pDVar3->RunningScripts,key);
      (pNVar4->Pair).Value = this;
    }
    Link(this);
    if ((level.flags2._2_1_ & 0x80) != 0) {
      PutLast(this);
    }
    ScriptPresentation((int)&local_50);
    DPrintf(4,"%s started.\n",local_50.Chars);
    FString::~FString(&local_50);
    return;
  }
  __assert_fail("code->VarCount >= code->ArgCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                ,0x25c7,
                "DLevelScript::DLevelScript(AActor *, line_t *, int, const ScriptPtr *, FBehavior *, const int *, int, int)"
               );
}

Assistant:

DLevelScript::DLevelScript (AActor *who, line_t *where, int num, const ScriptPtr *code, FBehavior *module,
	const int *args, int argcount, int flags)
	: activeBehavior (module)
{
	if (DACSThinker::ActiveThinker == NULL)
		new DACSThinker;

	script = num;
	assert(code->VarCount >= code->ArgCount);
	Localvars.Resize(code->VarCount);
	memset(&Localvars[0], 0, code->VarCount * sizeof(SDWORD));
	for (int i = 0; i < MIN<int>(argcount, code->ArgCount); ++i)
	{
		Localvars[i] = args[i];
	}
	pc = module->GetScriptAddress(code);
	InModuleScriptNumber = module->GetScriptIndex(code);
	activator = who;
	activationline = where;
	backSide = flags & ACS_BACKSIDE;
	activefont = SmallFont;
	hudwidth = hudheight = 0;
	ClipRectLeft = ClipRectTop = ClipRectWidth = ClipRectHeight = WrapWidth = 0;
	HandleAspect = true;
	state = SCRIPT_Running;

	// Hexen waited one second before executing any open scripts. I didn't realize
	// this when I wrote my ACS implementation. Now that I know, it's still best to
	// run them right away because there are several map properties that can't be
	// set in an editor. If an open script sets them, it looks dumb if a second
	// goes by while they're in their default state.

	if (!(flags & ACS_ALWAYS))
		DACSThinker::ActiveThinker->RunningScripts[num] = this;

	Link();

	if (level.flags2 & LEVEL2_HEXENHACK)
	{
		PutLast();
	}

	DPrintf(DMSG_SPAMMY, "%s started.\n", ScriptPresentation(num).GetChars());
}